

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_stats.h
# Opt level: O0

void arena_stats_add_u64(tsdn_t *tsdn,arena_stats_t *arena_stats,arena_stats_u64_t *p,uint64_t x)

{
  uint64_t x_local;
  arena_stats_u64_t *p_local;
  arena_stats_t *arena_stats_local;
  tsdn_t *tsdn_local;
  
  LOCK();
  p->repr = p->repr + x;
  UNLOCK();
  return;
}

Assistant:

static inline void
arena_stats_add_u64(tsdn_t *tsdn, arena_stats_t *arena_stats,
    arena_stats_u64_t *p, uint64_t x) {
#ifdef JEMALLOC_ATOMIC_U64
	atomic_fetch_add_u64(p, x, ATOMIC_RELAXED);
#else
	malloc_mutex_assert_owner(tsdn, &arena_stats->mtx);
	*p += x;
#endif
}